

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

char * Acb_EnumerateSatAssigns
                 (sat_solver *pSat,int PivotVar,int FreeVar,Vec_Int_t *vDivVars,Vec_Int_t *vTempLits
                 ,Vec_Str_t *vTempSop)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  char *pcVar5;
  int *piVar6;
  int *end;
  int iLit_1;
  Vec_Int_t *vLits;
  Vec_Int_t *vTemp;
  int pLits [2];
  int *pFinal;
  int nFinal;
  int iLit;
  int iVar;
  int iMint;
  int i;
  int status;
  int fCreatePrime;
  Vec_Str_t *vTempSop_local;
  Vec_Int_t *vTempLits_local;
  Vec_Int_t *vDivVars_local;
  int FreeVar_local;
  int PivotVar_local;
  sat_solver *pSat_local;
  
  iVar1 = sat_solver_nvars(pSat);
  if (iVar1 <= FreeVar) {
    __assert_fail("FreeVar < sat_solver_nvars(pSat)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                  ,0x5e6,
                  "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                 );
  }
  vTemp._0_4_ = Abc_Var2Lit(PivotVar,1);
  vTemp._4_4_ = Abc_Var2Lit(FreeVar,0);
  Vec_StrClear(vTempSop);
  iVar1 = Vec_IntSize(vDivVars);
  Vec_StrGrow(vTempSop,(iVar1 + 3) * 8 + 1);
  iVar1 = sat_solver_solve(pSat,(lit *)&vTemp,pLits,0,0,0,0);
  if (iVar1 == -1) {
    Vec_StrPush(vTempSop,' ');
    Vec_StrPush(vTempSop,'0');
    Vec_StrPush(vTempSop,'\n');
    Vec_StrPush(vTempSop,'\0');
    pSat_local = (sat_solver *)Vec_StrReleaseArray(vTempSop);
  }
  else {
    vTemp._0_4_ = Abc_LitNot((int)vTemp);
    iVar1 = sat_solver_solve(pSat,(lit *)&vTemp,pLits,0,0,0,0);
    vTemp._0_4_ = Abc_LitNot((int)vTemp);
    if ((iVar1 == -1) || (iVar1 = Vec_IntSize(vDivVars), iVar1 == 0)) {
      Vec_StrPush(vTempSop,' ');
      Vec_StrPush(vTempSop,'1');
      Vec_StrPush(vTempSop,'\n');
      Vec_StrPush(vTempSop,'\0');
      pSat_local = (sat_solver *)Vec_StrReleaseArray(vTempSop);
    }
    else {
      p = Vec_IntAlloc(100);
      p_00 = Vec_IntAlloc(100);
      for (iLit = 0; iLit != 1000; iLit = iLit + 1) {
        iVar1 = sat_solver_solve(pSat,(lit *)&vTemp,pLits,0,0,0,0);
        if (iVar1 == -1) {
          printf("Finished enumerating %d cubes.\n");
          Vec_IntFree(p);
          Vec_IntFree(p_00);
          Vec_StrPush(vTempSop,'\0');
          pcVar5 = Vec_StrReleaseArray(vTempSop);
          return pcVar5;
        }
        if (iVar1 != 1) {
          __assert_fail("status == l_True",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                        ,0x623,
                        "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                       );
        }
        Vec_IntClear(vTempLits);
        iVar1 = Abc_LitNot((int)vTemp);
        Vec_IntPush(vTempLits,iVar1);
        iVar = Vec_IntSize(vDivVars);
        while (iVar = iVar + -1, -1 < iVar) {
          iVar1 = Vec_IntEntry(vDivVars,iVar);
          iVar1 = sat_solver_var_literal(pSat,iVar1);
          Vec_IntPush(vTempLits,iVar1);
        }
        for (iVar = 0; iVar1 = Vec_IntSize(vDivVars), iVar < iVar1; iVar = iVar + 1) {
          Vec_StrPush(vTempSop,'-');
        }
        iVar1 = Vec_IntEntry(vTempLits,0);
        iVar1 = sat_solver_push(pSat,iVar1);
        if (iVar1 != 1) {
          __assert_fail("status == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                        ,0x636,
                        "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                       );
        }
        piVar6 = Vec_IntArray(vTempLits);
        iVar1 = Vec_IntSize(vTempLits);
        iVar1 = sat_solver_minimize_assumptions(pSat,piVar6 + 1,iVar1 + -1,0);
        Vec_IntShrink(vTempLits,iVar1 + 1);
        sat_solver_pop(pSat);
        iVar1 = Abc_LitNot(vTemp._4_4_);
        Vec_IntWriteEntry(vTempLits,0,iVar1);
        for (iVar = 1; iVar1 = Vec_IntSize(vTempLits), iVar < iVar1; iVar = iVar + 1) {
          iVar1 = Vec_IntEntry(vTempLits,iVar);
          iVar2 = Abc_LitNot(iVar1);
          Vec_IntWriteEntry(vTempLits,iVar,iVar2);
          iVar2 = Abc_Lit2Var(iVar1);
          iVar2 = Vec_IntFind(vDivVars,iVar2);
          if (iVar2 < 0) {
            __assert_fail("iVar >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                          ,0x63f,
                          "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                         );
          }
          iVar3 = Vec_StrSize(vTempSop);
          iVar4 = Vec_IntSize(vDivVars);
          iVar1 = Abc_LitIsCompl(iVar1);
          Vec_StrWriteEntry(vTempSop,(iVar3 - iVar4) + iVar2,((iVar1 != 0 ^ 0xffU) & 1) + 0x30);
        }
        Vec_StrAppend(vTempSop," 1\n");
        piVar6 = Vec_IntArray(vTempLits);
        end = Vec_IntLimit(vTempLits);
        iVar1 = sat_solver_addclause(pSat,piVar6,end);
        if (iVar1 == 0) {
          __assert_fail("status",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                        ,0x68f,
                        "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                       );
        }
      }
      iVar1 = Vec_IntSize(vDivVars);
      if (iVar1 == 0) {
        printf("Assuming constant 0 function.\n");
        Vec_StrClear(vTempSop);
        Vec_StrPush(vTempSop,' ');
        Vec_StrPush(vTempSop,'0');
        Vec_StrPush(vTempSop,'\n');
        Vec_StrPush(vTempSop,'\0');
        pSat_local = (sat_solver *)Vec_StrReleaseArray(vTempSop);
      }
      else {
        printf("Reached the limit on the number of cubes (1000).\n");
        Vec_IntFree(p);
        Vec_IntFree(p_00);
        pSat_local = (sat_solver *)0x0;
      }
    }
  }
  return (char *)pSat_local;
}

Assistant:

char * Acb_EnumerateSatAssigns( sat_solver * pSat, int PivotVar, int FreeVar, Vec_Int_t * vDivVars, Vec_Int_t * vTempLits, Vec_Str_t * vTempSop )
{
    int fCreatePrime = 1;
    int status, i, iMint, iVar, iLit, nFinal, * pFinal, pLits[2];
    Vec_Int_t * vTemp, * vLits;
    assert( FreeVar < sat_solver_nvars(pSat) );
    pLits[0] = Abc_Var2Lit( PivotVar, 1 ); // F = 1
    pLits[1] = Abc_Var2Lit( FreeVar, 0 );  // iNewLit
    Vec_StrClear( vTempSop );
    Vec_StrGrow( vTempSop, 8 * (Vec_IntSize(vDivVars) + 3) + 1 );
    // check constant 0
    status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
    if ( status == l_False )
    {
        Vec_StrPush( vTempSop, ' ' );
        Vec_StrPush( vTempSop, '0' );
        Vec_StrPush( vTempSop, '\n' );
        Vec_StrPush( vTempSop, '\0' );
        return Vec_StrReleaseArray(vTempSop);
    }
    // check constant 1
    pLits[0] = Abc_LitNot(pLits[0]);
    status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
    pLits[0] = Abc_LitNot(pLits[0]);
    if ( status == l_False || Vec_IntSize(vDivVars) == 0 )
    {
        Vec_StrPush( vTempSop, ' ' );
        Vec_StrPush( vTempSop, '1' );
        Vec_StrPush( vTempSop, '\n' );
        Vec_StrPush( vTempSop, '\0' );
        return Vec_StrReleaseArray(vTempSop);
    }
    //Vec_IntPrint( vDivVars );
    vTemp = Vec_IntAlloc( 100 );
    vLits = Vec_IntAlloc( 100 );
    for ( iMint = 0; ; iMint++ )
    {
        if ( iMint == 1000 )
        {
            if ( Vec_IntSize(vDivVars) == 0 )
            {
                printf( "Assuming constant 0 function.\n" );
                Vec_StrClear( vTempSop );
                Vec_StrPush( vTempSop, ' ' );
                Vec_StrPush( vTempSop, '0' );
                Vec_StrPush( vTempSop, '\n' );
                Vec_StrPush( vTempSop, '\0' );
                return Vec_StrReleaseArray(vTempSop);
            }

            printf( "Reached the limit on the number of cubes (1000).\n" );
            Vec_IntFree( vTemp );
            Vec_IntFree( vLits );
            return NULL;
        }
        //int Offset = Vec_StrSize(vTempSop);
        // find onset minterm
        status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
        if ( status == l_False )
        {
            printf( "Finished enumerating %d cubes.\n", iMint );
            Vec_IntFree( vTemp );
            Vec_IntFree( vLits );
            Vec_StrPush( vTempSop, '\0' );
            return Vec_StrReleaseArray(vTempSop);
        }
        assert( status == l_True );
        // collect divisor literals
        Vec_IntClear( vTempLits );
        Vec_IntPush( vTempLits, Abc_LitNot(pLits[0]) ); // F = 0
        //printf( "%8d %3d  ", 0, 0 );
//        Vec_IntForEachEntry( vDivVars, iVar, i )
        Vec_IntForEachEntryReverse( vDivVars, iVar, i )
        {
            Vec_IntPush( vTempLits, sat_solver_var_literal(pSat, iVar) );
            //printf( "%c", '0' + sat_solver_var_value(pSat, iVar) );
        }
        //printf( "\n" );
        // create new cube
        for ( i = 0; i < Vec_IntSize(vDivVars); i++ )
            Vec_StrPush( vTempSop, '-' );
        if ( fCreatePrime )
        {
            // expand against offset
            status = sat_solver_push(pSat, Vec_IntEntry(vTempLits, 0));
            assert( status == 1 );
            nFinal = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vTempLits)+1, Vec_IntSize(vTempLits)-1, 0 );
            Vec_IntShrink( vTempLits, nFinal+1 );
            sat_solver_pop(pSat);
            // compute cube and add clause
            Vec_IntWriteEntry( vTempLits, 0, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
            Vec_IntForEachEntryStart( vTempLits, iLit, i, 1 )
            {
                Vec_IntWriteEntry( vTempLits, i, Abc_LitNot(iLit) );
                iVar = Vec_IntFind( vDivVars, Abc_Lit2Var(iLit) );   assert( iVar >= 0 );
                //uCube &= Abc_LitIsCompl(pFinal[i]) ? s_Truths6[iVar] : ~s_Truths6[iVar];
                Vec_StrWriteEntry( vTempSop, Vec_StrSize(vTempSop) - Vec_IntSize(vDivVars) + iVar, (char)('0' + !Abc_LitIsCompl(iLit)) );
            }
        }
        else
        {
            // expand against offset
            status = sat_solver_solve( pSat, Vec_IntArray(vTempLits), Vec_IntLimit(vTempLits), 0, 0, 0, 0 );
            if ( status != l_False )
                printf( "Selected onset minterm number %d belongs to the offset (this is a bug).\n", iMint );
            assert( status == l_False );

            // compute cube and add clause
            nFinal = sat_solver_final( pSat, &pFinal );
            Vec_IntSelectSort( pFinal, nFinal );
/*
            // pretend that this is final
            veci_resize(&pSat->conf_final,0);
            Vec_IntForEachEntry( vTempLits, iLit, i )
                veci_push(&pSat->conf_final, lit_neg(iLit));
            pFinal = pSat->conf_final.ptr;
            nFinal = Vec_IntSize(vTempLits);
*/
            ////////////////////////////////////////////////////////
            // create new cube
            Vec_IntClear( vTemp );
            Vec_IntPush( vTemp, Abc_LitNot(pLits[0]) ); // F = 0
            for ( i = 0; i < nFinal; i++ )
            {
                if ( pFinal[i] == pLits[0] )
                    continue;
                Vec_IntPush( vTemp, Abc_LitNot(pFinal[i]) );
            }

            //Vec_IntPrint( vTemp );
            // try removing each one starting with the last one
            //printf( "Started with %d lits   ", nFinal-1 );
            for ( i = nFinal - 1; i > 0; i-- )
            {
                int iLit = Vec_IntEntry( vTemp, i );
                Vec_IntDrop( vTemp, i );
                // try SAT
                status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), 0, 0, 0, 0 );
                if ( status == l_False )
                {
                //    printf( "U" );
                    continue;
                }
                //if ( status == l_True )
                //    printf( "S" );
                //else if ( status == l_Undef )
                //    printf( "T" );
                Vec_IntInsert( vTemp, i, iLit );
            }
            //printf( "   Ended up with %d lits\n", Vec_IntSize(vTemp)-1 );
            //Vec_IntPrint( vTemp );

            Vec_IntForEachEntry( vTemp, iLit, i )
                pFinal[i] = Abc_LitNot(iLit);
            nFinal = Vec_IntSize(vTemp);
            ////////////////////////////////////////////////////////


            Vec_IntClear( vTempLits );
            Vec_IntPush( vTempLits, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
            for ( i = 0; i < nFinal; i++ )
            {
                if ( pFinal[i] == pLits[0] )
                    continue;
                Vec_IntPush( vTempLits, pFinal[i] );
                iVar = Vec_IntFind( vDivVars, Abc_Lit2Var(pFinal[i]) );   assert( iVar >= 0 );
                //uCube &= Abc_LitIsCompl(pFinal[i]) ? s_Truths6[iVar] : ~s_Truths6[iVar];
                Vec_StrWriteEntry( vTempSop, Vec_StrSize(vTempSop) - Vec_IntSize(vDivVars) + iVar, (char)('0' + Abc_LitIsCompl(pFinal[i])) );
            }
        }
        //printf( "%6d : %8d %3d  ", iMint, (int)pSat->stats.conflicts, Vec_IntSize(vTempLits)-1 );

        Vec_StrAppend( vTempSop, " 1\n" );
        status = sat_solver_addclause( pSat, Vec_IntArray(vTempLits), Vec_IntLimit(vTempLits) );
        assert( status );

        //Vec_StrPush( vTempSop, '\0' );
        //printf( "%s", Vec_StrEntryP(vTempSop, Offset) );
        //Vec_StrPop( vTempSop );
    }
    assert( 0 ); 
    return NULL;
}